

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O1

int cmime_list_insert_next(CMimeList_T *list,CMimeListElem_T *elem,void *data)

{
  _CMimeListElem *p_Var1;
  _CMimeListElem *__ptr;
  _CMimeListElem **pp_Var2;
  int iVar3;
  
  __ptr = (_CMimeListElem *)calloc(1,0x18);
  if (list != (CMimeList_T *)0x0) {
    iVar3 = -1;
    if (__ptr != (_CMimeListElem *)0x0) {
      if ((elem == (CMimeListElem_T *)0x0) && (list->size != 0)) {
        free(__ptr);
      }
      else {
        __ptr->data = data;
        iVar3 = list->size;
        if (iVar3 == 0) {
          list->head = __ptr;
          list->tail = __ptr;
          __ptr->prev = (_CMimeListElem *)0x0;
          __ptr->next = (_CMimeListElem *)0x0;
        }
        else {
          p_Var1 = elem->next;
          __ptr->next = p_Var1;
          __ptr->prev = elem;
          pp_Var2 = &p_Var1->prev;
          if (p_Var1 == (_CMimeListElem *)0x0) {
            pp_Var2 = &list->tail;
          }
          *pp_Var2 = __ptr;
          elem->next = __ptr;
        }
        list->size = iVar3 + 1;
        iVar3 = 0;
      }
    }
    return iVar3;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                ,0x84,"int cmime_list_insert_next(CMimeList_T *, CMimeListElem_T *, void *)");
}

Assistant:

int cmime_list_insert_next(CMimeList_T *list, CMimeListElem_T *elem, void *data) {
    CMimeListElem_T *new = (CMimeListElem_T *)calloc(1,sizeof(CMimeListElem_T));
    
    assert(list);
        
    if(new == NULL) {
        return(-1);
    }
    
    /* no null element if list not empty */
    if(elem == NULL && cmime_list_size(list) != 0) {
        free(new);
        return(-1);
    }
 
    new->data = data;
 
    if(cmime_list_size(list) == 0) {
        list->head = new;
        list->tail = new;
        new->next = NULL;
        new->prev = NULL;
    } else {
        new->next = elem->next;
        new->prev = elem;

        if(elem->next == NULL) {
            list->tail = new;
        } else {
            elem->next->prev = new;
        }

        elem->next = new; 
    }
 
    list->size++;
 
    return(0);
}